

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::getVLV(Binasc *this,istream *infile,int *trackbytes)

{
  byte local_25;
  uint local_24;
  uchar ch;
  int *piStack_20;
  int output;
  int *trackbytes_local;
  istream *infile_local;
  Binasc *this_local;
  
  local_24 = 0;
  piStack_20 = trackbytes;
  trackbytes_local = (int *)infile;
  infile_local = (istream *)this;
  std::istream::read((char *)infile,(long)&local_25);
  *piStack_20 = *piStack_20 + 1;
  local_24 = local_24 << 7 | local_25 & 0x7f;
  while (0x7f < local_25) {
    std::istream::read((char *)trackbytes_local,(long)&local_25);
    *piStack_20 = *piStack_20 + 1;
    local_24 = local_24 << 7 | local_25 & 0x7f;
  }
  return local_24;
}

Assistant:

int Binasc::getVLV(std::istream& infile, int& trackbytes) {
	int output = 0;
	uchar ch;
	infile.read((char*)&ch, 1);
	trackbytes++;
	output = (output << 7) | (0x7f & ch);
	while (ch >= 0x80) {
		infile.read((char*)&ch, 1);
		trackbytes++;
		output = (output << 7) | (0x7f & ch);
	}
	return output;
}